

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_ReflectionSwapFields_Test::TestBody
          (ArenaTest_ReflectionSwapFields_Test *this)

{
  TestAllTypes *pTVar1;
  TestAllTypes *pTVar2;
  Reflection *this_00;
  pointer *__ptr;
  char *pcVar3;
  Metadata MVar4;
  AssertionResult gtest_ar_6;
  string output;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  TestAllTypes message;
  Arena arena1;
  Arena arena2;
  AssertHelper local_518;
  AssertHelper local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  AssertHelper local_500;
  string local_4f8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_4d8;
  undefined1 local_4c0 [8];
  TaggedAllocationPolicyPtr local_4b8;
  ThreadSafeArena local_180;
  ThreadSafeArena local_d8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_180);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_d8);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_180);
  pTVar2 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_d8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  MVar4 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  this_00 = MVar4.reflection;
  local_4d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,(Message *)pTVar1,&local_4d8);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&local_4d8);
  local_510.data_ =
       (AssertHelperData *)(pTVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_510.data_ & 1) != 0) {
    local_510.data_ = *(AssertHelperData **)((ulong)local_510.data_ & 0xfffffffffffffffe);
  }
  local_4f8._M_dataplus._M_p = (pointer)&local_180;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)local_4c0,"&arena1","arena1_message->GetArena()",(Arena **)&local_4f8,
             (Arena **)&local_510);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4f8);
    if ((AssertHelperData *)local_4b8.policy_ == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_4b8.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2ce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_510,(Message *)&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    if ((ThreadSafeArena *)local_4f8._M_dataplus._M_p != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_4f8._M_dataplus._M_p + 8))();
    }
  }
  if ((AssertHelperData *)local_4b8.policy_ != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8.policy_);
  }
  local_510.data_ =
       (AssertHelperData *)(pTVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_510.data_ & 1) != 0) {
    local_510.data_ = *(AssertHelperData **)((ulong)local_510.data_ & 0xfffffffffffffffe);
  }
  local_4f8._M_dataplus._M_p = (pointer)&local_d8;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)local_4c0,"&arena2","arena2_message->GetArena()",(Arena **)&local_4f8,
             (Arena **)&local_510);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4f8);
    if ((AssertHelperData *)local_4b8.policy_ == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_4b8.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2cf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_510,(Message *)&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    if ((ThreadSafeArena *)local_4f8._M_dataplus._M_p != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_4f8._M_dataplus._M_p + 8))();
    }
  }
  if ((AssertHelperData *)local_4b8.policy_ != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8.policy_);
  }
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  MessageLite::SerializeToString((MessageLite *)pTVar1,&local_4f8);
  local_518.data_ = (AssertHelperData *)((ulong)local_518.data_._4_4_ << 0x20);
  local_510.data_ = (AssertHelperData *)local_4f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_4c0,"0","output.size()",(int *)&local_518,(unsigned_long *)&local_510
            );
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_510);
    if ((AssertHelperData *)local_4b8.policy_ == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_4b8.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2d2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if (local_510.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_510.data_ + 8))();
    }
  }
  if ((AssertHelperData *)local_4b8.policy_ != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8.policy_);
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&local_4d8);
  MessageLite::SerializeToString((MessageLite *)pTVar2,&local_4f8);
  local_518.data_ = local_518.data_ & 0xffffffff00000000;
  local_510.data_ = (AssertHelperData *)local_4f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_4c0,"0","output.size()",(int *)&local_518,(unsigned_long *)&local_510
            );
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_510);
    if ((AssertHelperData *)local_4b8.policy_ == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_4b8.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2d6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if (local_510.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_510.data_ + 8))();
    }
  }
  if ((AssertHelperData *)local_4b8.policy_ != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8.policy_);
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_180);
  pTVar2 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_d8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&local_4d8);
  local_518.data_ =
       (AssertHelperData *)(pTVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_518.data_ & 1) != 0) {
    local_518.data_ = *(AssertHelperData **)((ulong)local_518.data_ & 0xfffffffffffffffe);
  }
  local_510.data_ = (AssertHelperData *)&local_180;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)local_4c0,"&arena1","arena1_message->GetArena()",(Arena **)&local_510,
             (Arena **)&local_518);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_510);
    if ((AssertHelperData *)local_4b8.policy_ == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_4b8.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2df,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if ((ThreadSafeArena *)local_510.data_ != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_510.data_ + 8))();
    }
  }
  if ((AssertHelperData *)local_4b8.policy_ != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8.policy_);
  }
  local_518.data_ =
       (AssertHelperData *)(pTVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_518.data_ & 1) != 0) {
    local_518.data_ = *(AssertHelperData **)((ulong)local_518.data_ & 0xfffffffffffffffe);
  }
  local_510.data_ = (AssertHelperData *)&local_d8;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)local_4c0,"&arena2","arena2_message->GetArena()",(Arena **)&local_510,
             (Arena **)&local_518);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_510);
    if ((AssertHelperData *)local_4b8.policy_ == (AssertHelperData *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_4b8.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2e0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if ((ThreadSafeArena *)local_510.data_ != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_510.data_ + 8))();
    }
  }
  if ((AssertHelperData *)local_4b8.policy_ != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8.policy_);
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_180);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena((ThreadSafeArena *)local_4c0);
  pTVar2 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)local_4c0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&local_4d8);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_4c0);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_180);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_4c0,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)local_4c0,&local_4d8);
  local_500.data_ =
       (AssertHelperData *)(pTVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_500.data_ & 1) != 0) {
    local_500.data_ = *(AssertHelperData **)((ulong)local_500.data_ & 0xfffffffffffffffe);
  }
  local_518.data_ = (AssertHelperData *)&local_180;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&local_510,"&arena1","arena1_message->GetArena()",(Arena **)&local_518,
             (Arena **)&local_500);
  if (local_510.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_518);
    if (local_508 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_508->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    if ((ThreadSafeArena *)local_518.data_ != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_518.data_ + 8))();
    }
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_508,local_508);
  }
  if ((local_4b8.policy_ & 1) != 0) {
    local_4b8.policy_ = *(undefined8 *)(local_4b8.policy_ & 0xfffffffffffffffe);
  }
  local_500.data_ = (AssertHelperData *)0x0;
  local_518.data_ = (AssertHelperData *)local_4b8.policy_;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&local_510,"nullptr","message.GetArena()",(Arena **)&local_500,
             (Arena **)&local_518);
  if (local_510.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_518);
    if (local_508 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_508->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    if (local_518.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_518.data_ + 8))();
    }
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_508,local_508);
  }
  MessageLite::SerializeToString((MessageLite *)pTVar1,&local_4f8);
  local_500.data_ = local_500.data_ & 0xffffffff00000000;
  local_518.data_ = (AssertHelperData *)local_4f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_510,"0","output.size()",(int *)&local_500,
             (unsigned_long *)&local_518);
  if (local_510.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_518);
    if (local_508 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_508->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    if (local_518.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_518.data_ + 8))();
    }
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_508,local_508);
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)local_4c0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  if (local_4d8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_180);
  return;
}

Assistant:

TEST(ArenaTest, ReflectionSwapFields) {
  Arena arena1;
  Arena arena2;
  TestAllTypes* arena1_message;
  TestAllTypes* arena2_message;

  // Case 1: messages on different arenas, only one message is set.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  arena2_message = Arena::Create<TestAllTypes>(&arena2);
  TestUtil::SetAllFields(arena1_message);
  const Reflection* reflection = arena1_message->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*arena1_message, &fields);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
  std::string output;
  arena1_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(*arena2_message);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  arena2_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(*arena1_message);

  // Case 2: messages on different arenas, both messages are set.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  arena2_message = Arena::Create<TestAllTypes>(&arena2);
  TestUtil::SetAllFields(arena1_message);
  TestUtil::SetAllFields(arena2_message);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
  TestUtil::ExpectAllFieldsSet(*arena1_message);
  TestUtil::ExpectAllFieldsSet(*arena2_message);

  // Case 3: messages on different arenas with different lifetimes.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  {
    Arena arena3;
    TestAllTypes* arena3_message = Arena::Create<TestAllTypes>(&arena3);
    TestUtil::SetAllFields(arena3_message);
    reflection->SwapFields(arena1_message, arena3_message, fields);
  }
  TestUtil::ExpectAllFieldsSet(*arena1_message);

  // Case 4: one message on arena, the other on heap.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  TestAllTypes message;
  TestUtil::SetAllFields(arena1_message);
  reflection->SwapFields(arena1_message, &message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(nullptr, message.GetArena());
  arena1_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(message);
}